

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

void Ree_ManComputeCutsTest(Gia_Man_t *p)

{
  uint uVar1;
  abctime aVar2;
  Vec_Int_t *vAdds;
  abctime aVar3;
  int level;
  
  aVar2 = Abc_Clock();
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar1 = Ree_ManCountFadds(vAdds);
  Ree_ManPrintAdders(vAdds,1);
  printf("Detected %d FAs and %d HAs.  ",(ulong)uVar1,(ulong)(vAdds->nSize / 6 - uVar1));
  Vec_IntFree(vAdds);
  level = (int)vAdds;
  aVar3 = Abc_Clock();
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return;
}

Assistant:

void Ree_ManComputeCutsTest( Gia_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int nFadds = Ree_ManCountFadds( vAdds );
    Ree_ManPrintAdders( vAdds, 1 );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Vec_IntFree( vAdds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}